

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_test.cpp
# Opt level: O0

void __thiscall
ot::commissioner::ErrorTest_ErrorToString_NonOkErrorToString_Test::
~ErrorTest_ErrorToString_NonOkErrorToString_Test
          (ErrorTest_ErrorToString_NonOkErrorToString_Test *this)

{
  ErrorTest_ErrorToString_NonOkErrorToString_Test *this_local;
  
  ~ErrorTest_ErrorToString_NonOkErrorToString_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(ErrorTest, ErrorToString_NonOkErrorToString)
{
// Check if the error string starts with the error name.
#define CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(aErrorName) \
    EXPECT_EQ((ERROR_##aErrorName("").ToString().find(#aErrorName)), 0U)

    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(CANCELLED);
    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(INVALID_ARGS);
    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(INVALID_COMMAND);
    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(TIMEOUT);
    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(NOT_FOUND);
    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(SECURITY);
    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(UNIMPLEMENTED);
    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(BAD_FORMAT);
    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(BUSY);
    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(OUT_OF_MEMORY);
    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(IO_ERROR);
    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(IO_BUSY);
    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(ALREADY_EXISTS);
    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(ABORTED);
    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(INVALID_STATE);
    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(REJECTED);
    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(COAP_ERROR);
    CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME(UNKNOWN);

#undef CHECK_ERROR_STR_STARTS_WITH_ERROR_NAME
}